

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O2

DWORD __thiscall FNodeBuilder::CheckLoopEnd(FNodeBuilder *this,fixed_t dx,fixed_t dy,int vertex)

{
  FPrivVert *pFVar1;
  FPrivSeg *pFVar2;
  uint uVar3;
  FPrivVert *pFVar4;
  FPrivSeg *pFVar5;
  angle_t aVar6;
  angle_t aVar7;
  int iVar8;
  ulong uVar9;
  DWORD *pDVar10;
  uint uVar11;
  uint uVar12;
  uint local_40;
  
  pFVar4 = (this->Vertices).Array;
  pFVar1 = pFVar4 + vertex;
  aVar6 = PointToAngle(dx,dy);
  pDVar10 = &pFVar4[vertex].segs;
  uVar12 = 0xffffffff;
  local_40 = 0xffffffff;
  while( true ) {
    uVar3 = *pDVar10;
    uVar9 = (ulong)uVar3;
    if (uVar9 == 0xffffffff) break;
    pFVar5 = (this->Segs).Array;
    pFVar4 = (this->Vertices).Array;
    pFVar2 = pFVar5 + uVar9;
    iVar8 = pFVar5[uVar9].v2;
    aVar7 = PointToAngle(pFVar4[iVar8].super_FSimpleVert.x - (pFVar1->super_FSimpleVert).x,
                         pFVar4[iVar8].super_FSimpleVert.y - (pFVar1->super_FSimpleVert).y);
    uVar11 = aVar7 - (aVar6 + 0x80000000);
    if (((4999 < uVar11) ||
        (iVar8 = pFVar2->v1, pFVar4 = (this->Vertices).Array,
        iVar8 = PointOnSide(pFVar4[iVar8].super_FSimpleVert.x,pFVar4[iVar8].super_FSimpleVert.y,
                            (pFVar1->super_FSimpleVert).x,(pFVar1->super_FSimpleVert).y,dx,dy),
        iVar8 != 0)) && (uVar11 <= uVar12)) {
      local_40 = uVar3;
      uVar12 = uVar11;
    }
    pDVar10 = &pFVar2->nextforvert;
  }
  if (local_40 != 0xffffffff) {
    pDVar10 = &pFVar1->segs2;
    do {
      uVar9 = (ulong)*pDVar10;
      if (uVar9 == 0xffffffff) {
        return local_40;
      }
      pFVar5 = (this->Segs).Array;
      pFVar4 = (this->Vertices).Array;
      pFVar2 = pFVar5 + uVar9;
      pDVar10 = &pFVar2->nextforvert2;
      iVar8 = pFVar2->v1;
      aVar7 = PointToAngle(pFVar4[iVar8].super_FSimpleVert.x - (pFVar1->super_FSimpleVert).x,
                           pFVar4[iVar8].super_FSimpleVert.y - (pFVar1->super_FSimpleVert).y);
    } while ((uVar12 <= aVar7 - (aVar6 + 0x80000000)) || (pFVar5[uVar9].partner == local_40));
  }
  return 0xffffffff;
}

Assistant:

DWORD FNodeBuilder::CheckLoopEnd (fixed_t dx, fixed_t dy, int vertex)
{
	FPrivVert *v = &Vertices[vertex];
	angle_t splitAngle = PointToAngle (dx, dy) + ANGLE_180;
	DWORD segnum;
	angle_t bestang;
	DWORD bestseg;

	// Find the seg starting at this vertex that forms the smallest angle
	// to the splitter.
	segnum = v->segs;
	bestang = ANGLE_MAX;
	bestseg = DWORD_MAX;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v2].x - v->x, Vertices[seg->v2].y - v->y);
		angle_t diff = segAngle - splitAngle;

		if (diff < ANGLE_EPSILON &&
			PointOnSide (Vertices[seg->v1].x, Vertices[seg->v1].y, v->x, v->y, dx, dy) == 0)
		{
			// If a seg lies right on the splitter, don't count it
		}
		else
		{
			if (diff <= bestang)
			{
				bestang = diff;
				bestseg = segnum;
			}
		}
		segnum = seg->nextforvert;
	}
	if (bestseg == DWORD_MAX)
	{
		return DWORD_MAX;
	}
	// Now make sure there are no segs ending at this vertex that form
	// an even smaller angle to the splitter.
	segnum = v->segs2;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v1].x - v->x, Vertices[seg->v1].y - v->y);
		angle_t diff = segAngle - splitAngle;
		if (diff < bestang && seg->partner != bestseg)
		{
			return DWORD_MAX;
		}
		segnum = seg->nextforvert2;
	}
	return bestseg;
}